

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetItemDefaultFocus(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImVec2 IVar3;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffc8;
  float center_y_ratio;
  ImVec2 local_28;
  ImRect local_20;
  ImGuiWindow *local_10;
  ImGuiContext *local_8;
  
  pIVar1 = GImGui;
  local_8 = GImGui;
  local_10 = GImGui->CurrentWindow;
  if (((((local_10->Appearing & 1U) != 0) && (GImGui->NavWindow == local_10->RootWindowForNav)) &&
      (((GImGui->NavInitRequest & 1U) != 0 || (GImGui->NavInitResultId != 0)))) &&
     (GImGui->NavLayer == (GImGui->NavWindow->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    pIVar1->NavInitResultId = (pIVar1->NavWindow->DC).LastItemId;
    local_28 = operator-(in_stack_ffffffffffffffc8,(ImVec2 *)0x14df68);
    IVar3 = operator-(in_stack_ffffffffffffffc8,(ImVec2 *)0x14df8d);
    center_y_ratio = IVar3.y;
    ImRect::ImRect(&local_20,&local_28,(ImVec2 *)&stack0xffffffffffffffd0);
    (local_8->NavInitResultRectRel).Min = local_20.Min;
    (local_8->NavInitResultRectRel).Max = local_20.Max;
    NavUpdateAnyRequestFlag();
    bVar2 = IsItemVisible();
    if (!bVar2) {
      SetScrollHereY(center_y_ratio);
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow == window->RootWindowForNav && (g.NavInitRequest || g.NavInitResultId != 0) && g.NavLayer == g.NavWindow->DC.NavLayerCurrent)
    {
        g.NavInitRequest = false;
        g.NavInitResultId = g.NavWindow->DC.LastItemId;
        g.NavInitResultRectRel = ImRect(g.NavWindow->DC.LastItemRect.Min - g.NavWindow->Pos, g.NavWindow->DC.LastItemRect.Max - g.NavWindow->Pos);
        NavUpdateAnyRequestFlag();
        if (!IsItemVisible())
            SetScrollHereY();
    }
}